

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cpp
# Opt level: O0

Type * __thiscall
psy::C::TypeChecker::typeOfStringLiteral(TypeChecker *this,EncodingPrefix encodingSuffix)

{
  ostream *poVar1;
  EncodingPrefix encodingSuffix_local;
  TypeChecker *this_local;
  
  switch(encodingSuffix) {
  case u8:
    this_local = (TypeChecker *)this->u8StrLitTy_;
    break;
  case u:
    this_local = (TypeChecker *)this->uStrLitTy_;
    break;
  case U:
    this_local = (TypeChecker *)this->UStrLitTy_;
    break;
  case L:
    this_local = (TypeChecker *)this->LStrLitTy_;
    break;
  case None:
    this_local = (TypeChecker *)this->strLitTy_;
    break;
  default:
    poVar1 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
    poVar1 = std::operator<<(poVar1,
                             "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/sema/TypeChecker.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x380);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = std::operator<<(poVar1,"<empty message>");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    this_local = (TypeChecker *)0x0;
  }
  return (Type *)this_local;
}

Assistant:

const Type* TypeChecker::typeOfStringLiteral(StringLiteral::EncodingPrefix encodingSuffix)
{
    switch (encodingSuffix) {
        case StringLiteral::EncodingPrefix::None:
            return strLitTy_;
        case StringLiteral::EncodingPrefix::u8:
            return u8StrLitTy_;
        case StringLiteral::EncodingPrefix::u:
            return uStrLitTy_;
        case StringLiteral::EncodingPrefix::U:
            return UStrLitTy_;
        case StringLiteral::EncodingPrefix::L:
            return LStrLitTy_;
        default:
            PSY_ASSERT_1(false);
            return nullptr;
    }
}